

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O2

xcb_input_set_device_modifier_mapping_cookie_t
xcb_input_set_device_modifier_mapping
          (xcb_connection_t *c,uint8_t device_id,uint8_t keycodes_per_modifier,uint8_t *keymaps)

{
  uint uVar1;
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  undefined4 local_70;
  uint8_t local_6c;
  uint8_t local_6b;
  undefined2 local_6a;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  uint8_t *local_28;
  ulong local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = 0xaaaaaaaaaaaaaaaa;
  uStack_50 = 0xaaaaaaaaaaaaaaaa;
  local_68 = 0xaaaaaaaaaaaaaaaa;
  uStack_60 = 0xaaaaaaaaaaaaaaaa;
  local_48 = &local_70;
  local_70 = 0xaaaaaaaa;
  local_6a = 0;
  local_40 = 8;
  local_38 = 0;
  uStack_30 = 0;
  local_20 = (ulong)(uint)((int)CONCAT71(in_register_00000011,keycodes_per_modifier) << 3);
  local_18 = 0;
  uStack_10 = 0;
  local_6c = device_id;
  local_6b = keycodes_per_modifier;
  local_28 = keymaps;
  uVar1 = xcb_send_request(c,1,&local_48,&xcb_input_set_device_modifier_mapping::xcb_req);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (xcb_input_set_device_modifier_mapping_cookie_t)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

xcb_input_set_device_modifier_mapping_cookie_t
xcb_input_set_device_modifier_mapping (xcb_connection_t *c,
                                       uint8_t           device_id,
                                       uint8_t           keycodes_per_modifier,
                                       const uint8_t    *keymaps)
{
    static const xcb_protocol_request_t xcb_req = {
        .count = 4,
        .ext = &xcb_input_id,
        .opcode = XCB_INPUT_SET_DEVICE_MODIFIER_MAPPING,
        .isvoid = 0
    };

    struct iovec xcb_parts[6];
    xcb_input_set_device_modifier_mapping_cookie_t xcb_ret;
    xcb_input_set_device_modifier_mapping_request_t xcb_out;

    xcb_out.device_id = device_id;
    xcb_out.keycodes_per_modifier = keycodes_per_modifier;
    memset(xcb_out.pad0, 0, 2);

    xcb_parts[2].iov_base = (char *) &xcb_out;
    xcb_parts[2].iov_len = sizeof(xcb_out);
    xcb_parts[3].iov_base = 0;
    xcb_parts[3].iov_len = -xcb_parts[2].iov_len & 3;
    /* uint8_t keymaps */
    xcb_parts[4].iov_base = (char *) keymaps;
    xcb_parts[4].iov_len = (keycodes_per_modifier * 8) * sizeof(uint8_t);
    xcb_parts[5].iov_base = 0;
    xcb_parts[5].iov_len = -xcb_parts[4].iov_len & 3;

    xcb_ret.sequence = xcb_send_request(c, XCB_REQUEST_CHECKED, xcb_parts + 2, &xcb_req);
    return xcb_ret;
}